

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

int Pdr_ManCountVariables(Pdr_Man_t *p,int kStart)

{
  int iVar1;
  Vec_Ptr_t *vCubes;
  Vec_Int_t *p_00;
  int iVar2;
  int i;
  Vec_Int_t *vFlopCounts;
  Vec_Int_t *local_28;
  
  vCubes = Pdr_ManCollectCubes(p,kStart);
  p_00 = Pdr_ManCountFlops(p,vCubes);
  iVar2 = 0;
  local_28 = p_00;
  for (i = 0; i < p_00->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(p_00,i);
    iVar2 = iVar2 + (uint)(0 < iVar1);
  }
  Vec_IntFreeP(&local_28);
  Vec_PtrFree(vCubes);
  return iVar2;
}

Assistant:

int Pdr_ManCountVariables( Pdr_Man_t * p, int kStart )
{
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    int i, Entry, Counter = 0;
    vCubes = Pdr_ManCollectCubes( p, kStart );
    vFlopCounts = Pdr_ManCountFlops( p, vCubes );
    Vec_IntForEachEntry( vFlopCounts, Entry, i )
        Counter += (Entry > 0);
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    return Counter;
}